

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_vector.hpp
# Opt level: O1

uint64_t __thiscall
poplar::
compact_bonsai_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
::node_map::operator[](node_map *this,uint64_t i)

{
  pointer puVar1;
  ulong uVar2;
  uint64_t uVar3;
  byte bVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  if (((this->done_flags_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
       ._M_impl.super__Vector_impl_data._M_start[i >> 6] >> (i & 0x3f) & 1) == 0) {
    return 0xffffffffffffffff;
  }
  puVar1 = (this->map_low_).chunks_.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar2 = (this->map_low_).width_;
  uVar5 = uVar2 * i;
  uVar8 = uVar5 >> 6;
  uVar6 = (ulong)((uint)uVar5 & 0x3f);
  uVar7 = puVar1[uVar8];
  if ((this->map_high_).size_ != 0) {
    if (uVar6 + uVar2 < 0x41) {
      uVar7 = uVar7 >> uVar6;
    }
    else {
      bVar4 = (byte)uVar5 & 0x3f;
      uVar7 = uVar7 >> bVar4 | puVar1[uVar8 + 1] << 0x40 - bVar4;
    }
    puVar1 = (this->map_high_).chunks_.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar3 = (this->map_high_).width_;
    uVar6 = i * uVar3;
    uVar8 = (ulong)((uint)uVar6 & 0x3f);
    uVar5 = puVar1[uVar6 >> 6];
    if (uVar3 + uVar8 < 0x41) {
      uVar5 = uVar5 >> uVar8;
    }
    else {
      bVar4 = (byte)uVar6 & 0x3f;
      uVar5 = uVar5 >> bVar4 | puVar1[(uVar6 >> 6) + 1] << 0x40 - bVar4;
    }
    return (uVar5 & (this->map_high_).mask_) << (uVar2 & 0x3f) | uVar7 & (this->map_low_).mask_;
  }
  if (uVar6 + uVar2 < 0x41) {
    uVar7 = uVar7 >> uVar6;
  }
  else {
    bVar4 = (byte)uVar5 & 0x3f;
    uVar7 = uVar7 >> bVar4 | puVar1[uVar8 + 1] << 0x40 - bVar4;
  }
  return uVar7 & (this->map_low_).mask_;
}

Assistant:

bool get(uint64_t i) const {
        assert(i < size_);
        return bit_tools::get_bit(chunks_[i / 64], i % 64);
    }